

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cEnhancedLayoutsTests.cpp
# Opt level: O2

void __thiscall
gl4cts::EnhancedLayouts::Utils::Variable::Descriptor::Descriptor
          (Descriptor *this,GLchar *name,GLchar *qualifiers,GLint expected_component,
          GLint expected_location,Type *type,GLboolean normalized,GLuint n_array_elements,
          GLint expected_stride_of_element,GLuint offset)

{
  allocator<char> local_32;
  allocator<char> local_31;
  
  this->m_expected_component = expected_component;
  this->m_expected_location = expected_location;
  this->m_expected_stride_of_element = expected_stride_of_element;
  this->m_n_array_elements = n_array_elements;
  std::__cxx11::string::string<std::allocator<char>>((string *)&this->m_name,name,&local_31);
  this->m_normalized = normalized;
  this->m_offset = offset;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&this->m_qualifiers,qualifiers,&local_32);
  this->m_type = BUILTIN;
  (this->field_9).m_interface = *(Interface **)type;
  (this->field_9).m_builtin.m_n_rows = type->m_n_rows;
  return;
}

Assistant:

Variable::Descriptor::Descriptor(const GLchar* name, const GLchar* qualifiers, GLint expected_component,
								 GLint expected_location, const Type& type, GLboolean normalized,
								 GLuint n_array_elements, GLint expected_stride_of_element, GLuint offset)
	: m_expected_component(expected_component)
	, m_expected_location(expected_location)
	, m_expected_stride_of_element(expected_stride_of_element)
	, m_n_array_elements(n_array_elements)
	, m_name(name)
	, m_normalized(normalized)
	, m_offset(offset)
	, m_qualifiers(qualifiers)
	, m_type(BUILTIN)
	, m_builtin(type)
{
}